

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O0

size_t google::protobuf::internal::(anonymous_namespace)::
       MapValueByteSizeLong<google::protobuf::internal::MapDynamicFieldEnumValueInfo<google::protobuf::MapValueRef_const>>
                 (Type type,MapDynamicFieldEnumValueInfo<const_google::protobuf::MapValueRef> info)

{
  int value;
  size_t sVar1;
  MapDynamicFieldEnumValueInfo<const_google::protobuf::MapValueRef> MStack_10;
  Type type_local;
  MapDynamicFieldEnumValueInfo<const_google::protobuf::MapValueRef> info_local;
  
  MStack_10.value = info.value;
  value = MapDynamicFieldEnumValueInfo<const_google::protobuf::MapValueRef>::Get
                    (&stack0xfffffffffffffff0);
  sVar1 = MapPrimitiveFieldByteSize<(google::protobuf::internal::FieldDescriptorLite::CppType)8,int>
                    (type,value);
  return sVar1;
}

Assistant:

inline size_t MapValueByteSizeLong(FieldDescriptor::Type type, InfoT info) {
  // There is a bug in GCC 9.5 where if-constexpr arguments are not understood
  // if passed into a helper function. A reproduction of the bug can be found
  // at: https://godbolt.org/z/65qW3vGhP
  // This is fixed in GCC 10.1+.
  (void)type;  // Suppress -Wunused-but-set-parameter

  if constexpr (info.cpp_type == FieldDescriptor::CPPTYPE_STRING) {
    return WireFormatLite::StringSize(info.Get());
  } else if constexpr (info.cpp_type == FieldDescriptor::CPPTYPE_MESSAGE) {
    ABSL_CHECK_NE(type, FieldDescriptor::TYPE_GROUP);
    return WireFormatLite::MessageSize(info.Get());
  } else {
    return MapPrimitiveFieldByteSize<info.cpp_type>(type, info.Get());
  }
}